

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O0

void __thiscall QBitArray::resize(QBitArray *this,qsizetype size)

{
  char *data;
  qsizetype storageSize;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  QByteArray *in_stack_ffffffffffffffe0;
  
  if ((long)in_RSI < 1) {
    QByteArray::resize(in_RSI,(qsizetype)in_RDI);
  }
  else {
    allocation_size((qsizetype)in_stack_ffffffffffffffe0);
    QByteArray::resize(in_RSI,(qsizetype)in_RDI,(char)((ulong)in_stack_ffffffffffffffe0 >> 0x38));
    data = QByteArray::data(in_stack_ffffffffffffffe0);
    storageSize = QByteArray::size(in_RDI);
    adjust_head_and_tail(data,storageSize,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void QBitArray::resize(qsizetype size)
{
    Q_ASSERT_X(size >= 0, "QBitArray::resize", "Size must be greater than or equal to 0.");
    if (size <= 0) {
        d.resize(0);
    } else {
        d.resize(allocation_size(size), 0x00);
        adjust_head_and_tail(d.data(), d.size(), size);
    }
}